

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_publisher_link.cpp
# Opt level: O2

void __thiscall
miniros::TransportPublisherLink::onRetryTimer
          (TransportPublisherLink *this,SteadyTimerEvent *param_1)

{
  bool bVar1;
  int iVar2;
  DurationBase<miniros::WallDuration> *pDVar3;
  undefined4 extraout_var;
  string *psVar4;
  PollManagerPtr *pPVar5;
  ConnectionManagerPtr *pCVar6;
  socklen_t in_ECX;
  sockaddr *__addr;
  _Any_data local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  string topic;
  ConnectionPtr connection;
  TransportTCPPtr transport;
  SubscriptionPtr parent;
  __shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  TransportTCPPtr old_transport;
  
  if ((this->dropping_ == false) && (this->needs_retry_ == true)) {
    topic._M_dataplus._M_p = (pointer)SteadyTime::now();
    bVar1 = TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator>
                      ((TimeBase<miniros::SteadyTime,_miniros::WallDuration> *)&topic,
                       &this->next_retry_);
    if (bVar1) {
      DurationBase<miniros::WallDuration>::operator*
                ((DurationBase<miniros::WallDuration> *)&topic,2.0);
      WallDuration::WallDuration((WallDuration *)&local_b8,20.0);
      pDVar3 = &std::min<miniros::WallDuration>((WallDuration *)&topic,(WallDuration *)&local_b8)->
                super_DurationBase<miniros::WallDuration>;
      (this->retry_period_).super_DurationBase<miniros::WallDuration> = *pDVar3;
      this->needs_retry_ = false;
      std::__shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->super_PublisherLink).parent_);
      iVar2 = (*((((this->connection_).
                   super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 transport_).super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_Transport[9])();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&topic,"TCPROS",(allocator<char> *)local_b8._M_pod_data);
      bVar1 = std::operator==((char *)CONCAT44(extraout_var,iVar2),&topic);
      std::__cxx11::string::~string((string *)&topic);
      if (bVar1) {
        if (parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&topic,"unknown",(allocator<char> *)local_b8._M_pod_data);
        }
        else {
          psVar4 = Subscription::getName_abi_cxx11_
                             (parent.
                              super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
          std::__cxx11::string::string((string *)&topic,(string *)psVar4);
        }
        std::dynamic_pointer_cast<miniros::TransportTCP,miniros::Transport>
                  ((shared_ptr<miniros::Transport> *)&old_transport);
        __addr = (sockaddr *)
                 (ulong)(uint)(old_transport.
                               super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->connected_port_;
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (onRetryTimer::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_b8._M_pod_data,"miniros.transport_publisher_link",
                     (allocator<char> *)&transport);
          console::initializeLogLocation(&onRetryTimer::loc,(string *)&local_b8,Debug);
          std::__cxx11::string::~string((string *)local_b8._M_pod_data);
        }
        if (onRetryTimer::loc.level_ != Debug) {
          console::setLogLocationLevel(&onRetryTimer::loc,Debug);
          console::checkLogLocationEnabled(&onRetryTimer::loc);
        }
        psVar4 = &(old_transport.
                   super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  connected_host_;
        if (onRetryTimer::loc.logger_enabled_ == true) {
          in_ECX = 0x298a69;
          console::print((FilterBase *)0x0,onRetryTimer::loc.logger_,onRetryTimer::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp"
                         ,0x110,
                         "void miniros::TransportPublisherLink::onRetryTimer(const miniros::SteadyTimerEvent &)"
                         ,"Retrying connection to [%s:%d] for topic [%s]",(psVar4->_M_dataplus)._M_p
                         ,__addr,topic._M_dataplus._M_p);
        }
        pPVar5 = PollManager::instance();
        local_b8._M_unused._M_object =
             (pPVar5->super___shared_ptr<miniros::PollManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::make_shared<miniros::TransportTCP,miniros::PollSet*>((PollSet **)&transport);
        iVar2 = TransportTCP::connect
                          (transport.
                           super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,(int)psVar4,__addr,in_ECX);
        if ((char)iVar2 == '\0') {
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.initialized_ == false) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_b8._M_pod_data,"miniros.transport_publisher_link",
                       (allocator<char> *)&connection);
            console::initializeLogLocation
                      (&onRetryTimer(miniros::SteadyTimerEvent_const&)::loc,(string *)&local_b8,
                       Debug);
            std::__cxx11::string::~string((string *)local_b8._M_pod_data);
          }
          if (onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.level_ != Debug) {
            console::setLogLocationLevel(&onRetryTimer(miniros::SteadyTimerEvent_const&)::loc,Debug)
            ;
            console::checkLogLocationEnabled(&onRetryTimer(miniros::SteadyTimerEvent_const&)::loc);
          }
          if (onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.logger_,
                           onRetryTimer(miniros::SteadyTimerEvent_const&)::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport_publisher_link.cpp"
                           ,0x11e,
                           "void miniros::TransportPublisherLink::onRetryTimer(const miniros::SteadyTimerEvent &)"
                           ,"connect() failed when retrying connection to [%s:%d] for topic [%s]",
                           (psVar4->_M_dataplus)._M_p,__addr,topic._M_dataplus._M_p);
          }
        }
        else {
          std::make_shared<miniros::Connection>();
          std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<miniros::TransportTCP,void>
                    (local_48,&transport.
                               super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>
                    );
          local_a8 = 0;
          uStack_a0 = 0;
          local_b8._M_unused._M_object = (element_type *)0x0;
          local_b8._8_8_ = 0;
          Connection::initialize
                    (connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(TransportPtr *)local_48,false,(HeaderReceivedFunc *)&local_b8);
          std::_Function_base::~_Function_base((_Function_base *)&local_b8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
          bVar1 = initialize(this,&connection);
          if (bVar1) {
            pCVar6 = ConnectionManager::instance();
            ConnectionManager::addConnection
                      ((pCVar6->
                       super___shared_ptr<miniros::ConnectionManager,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,&connection);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&connection.super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&old_transport.
                    super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&topic);
      }
      else if (parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               != (element_type *)0x0) {
        std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<miniros::PublisherLink,void>
                  ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)&topic,
                   (__weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2> *)
                   &(this->super_PublisherLink).
                    super_enable_shared_from_this<miniros::PublisherLink>);
        Subscription::removePublisherLink
                  (parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(PublisherLinkPtr *)&topic);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&topic._M_string_length);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&parent.super___shared_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  return;
}

Assistant:

void TransportPublisherLink::onRetryTimer(const miniros::SteadyTimerEvent&)
{
  if (dropping_)
  {
    return;
  }

  if (needs_retry_ && SteadyTime::now() > next_retry_)
  {
    retry_period_ = std::min<WallDuration>(retry_period_ * 2, WallDuration(20));
    needs_retry_ = false;
    SubscriptionPtr parent = parent_.lock();
    // TODO: support retry on more than just TCP
    // For now, since UDP does not have a heartbeat, we do not attempt to retry
    // UDP connections since an error there likely means some invalid operation has
    // happened.
    if (connection_->getTransport()->getType() == std::string("TCPROS"))
    {
      std::string topic = parent ? parent->getName() : "unknown";

      TransportTCPPtr old_transport = std::dynamic_pointer_cast<TransportTCP>(connection_->getTransport());
      MINIROS_ASSERT(old_transport);
      const std::string& host = old_transport->getConnectedHost();
      int port = old_transport->getConnectedPort();

      MINIROS_DEBUG("Retrying connection to [%s:%d] for topic [%s]", host.c_str(), port, topic.c_str());

      TransportTCPPtr transport(std::make_shared<TransportTCP>(&PollManager::instance()->getPollSet()));
      if (transport->connect(host, port))
      {
        ConnectionPtr connection(std::make_shared<Connection>());
        connection->initialize(transport, false, HeaderReceivedFunc());
        if (initialize(connection))
        {
          ConnectionManager::instance()->addConnection(connection);
        }
      }
      else
      {
        MINIROS_DEBUG("connect() failed when retrying connection to [%s:%d] for topic [%s]", host.c_str(), port, topic.c_str());
      }
    }
    else if (parent)
    {
      parent->removePublisherLink(shared_from_this());
    }
  }
}